

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O3

char * tjGetErrorStr2(tjhandle handle)

{
  char *pcVar1;
  tjinstance *this;
  
  if ((handle != (tjhandle)0x0) && (*(int *)((long)handle + 0x6d0) != 0)) {
    *(undefined4 *)((long)handle + 0x6d0) = 0;
    return (char *)((long)handle + 0x608);
  }
  pcVar1 = (char *)__tls_get_addr(&PTR_0019ef20);
  return pcVar1;
}

Assistant:

DLLEXPORT char *tjGetErrorStr2(tjhandle handle)
{
  tjinstance *this = (tjinstance *)handle;

  if (this && this->isInstanceError) {
    this->isInstanceError = FALSE;
    return this->errStr;
  } else
    return errStr;
}